

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void testing::internal::TuplePrefixPrinter<2ul>::
     TersePrintPrefixToStrings<std::tuple<mp::expr::Kind,mp::LogicalCountExpr>>
               (tuple<mp::expr::Kind,_mp::LogicalCountExpr> *t,Strings *strings)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  TuplePrefixPrinter<1ul>::
  TersePrintPrefixToStrings<std::tuple<mp::expr::Kind,mp::LogicalCountExpr>>(t,strings);
  std::__cxx11::stringstream::stringstream(local_198);
  internal2::TypeWithoutFormatter<mp::LogicalCountExpr,_(testing::internal2::TypeKind)2>::PrintValue
            ((LogicalCountExpr *)t,local_188);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)strings,
             &bStack_1b8);
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

static void TersePrintPrefixToStrings(const Tuple& t, Strings* strings) {
    TuplePrefixPrinter<N - 1>::TersePrintPrefixToStrings(t, strings);
    ::std::stringstream ss;
    UniversalTersePrint(::std::tr1::get<N - 1>(t), &ss);
    strings->push_back(ss.str());
  }